

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsrv2_routing.c
# Opt level: O0

void olsrv2_routing_freeze_routes(_Bool freeze)

{
  _Bool freeze_local;
  
  if ((_freeze_routes != freeze) && (_freeze_routes = freeze, !freeze)) {
    olsrv2_routing_trigger_update();
  }
  return;
}

Assistant:

void
olsrv2_routing_freeze_routes(bool freeze) {
  if (_freeze_routes == freeze) {
    return;
  }

  _freeze_routes = freeze;
  if (!freeze) {
    /* make sure we have a current routing table */
    olsrv2_routing_trigger_update();
  }
}